

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_Blake2s_Simd128.c
# Opt level: O2

void reset_raw(Hacl_Hash_Blake2b_Simd256_state_t *state,
              K____Hacl_Impl_Blake2_Core_blake2_params___uint8_t_ key)

{
  uint8_t uVar1;
  uint8_t uVar2;
  byte bVar3;
  undefined8 uVar4;
  Lib_IntVector_Intrinsics_vec256 *hash;
  uint8_t *__dest;
  ulong __n;
  undefined2 local_4a;
  undefined6 uStack_48;
  
  uVar1 = (state->block_state).fst;
  uVar2 = (state->block_state).snd;
  uStack_48 = (undefined6)((ulong)(state->block_state).thd.fst >> 0x10);
  uVar4 = *(undefined8 *)&(state->block_state).field_0x2;
  local_4a = (undefined2)((ulong)uVar4 >> 0x30);
  hash = (state->block_state).thd.snd;
  __dest = state->buf;
  bVar3 = (key.fst)->key_length;
  __n = (ulong)bVar3;
  if (__n != 0) {
    memset(__dest + __n,0,(ulong)(0x80 - bVar3));
    memcpy(__dest,key.snd,__n);
  }
  init_with_params(hash,*key.fst);
  (state->block_state).fst = uVar1;
  (state->block_state).snd = uVar2;
  (state->block_state).thd.fst = (Lib_IntVector_Intrinsics_vec256 *)CONCAT62(uStack_48,local_4a);
  *(undefined8 *)&(state->block_state).field_0x2 = uVar4;
  (state->block_state).thd.snd = hash;
  state->buf = __dest;
  state->total_len = (ulong)(uVar1 != '\0') << 7;
  return;
}

Assistant:

static void
reset_raw(
  Hacl_Hash_Blake2s_Simd128_state_t *state,
  K____Hacl_Impl_Blake2_Core_blake2_params___uint8_t_ key
)
{
  Hacl_Hash_Blake2s_Simd128_state_t scrut = *state;
  uint8_t *buf = scrut.buf;
  Hacl_Hash_Blake2s_Simd128_block_state_t block_state = scrut.block_state;
  uint8_t nn0 = block_state.snd;
  uint8_t kk10 = block_state.fst;
  Hacl_Hash_Blake2b_index i = { .key_length = kk10, .digest_length = nn0 };
  KRML_MAYBE_UNUSED_VAR(i);
  Hacl_Hash_Blake2b_blake2_params *p = key.fst;
  uint8_t kk1 = p->key_length;
  uint8_t nn = p->digest_length;
  Hacl_Hash_Blake2b_index i1 = { .key_length = kk1, .digest_length = nn };
  uint32_t kk2 = (uint32_t)i1.key_length;
  uint8_t *k_1 = key.snd;
  if (!(kk2 == 0U))
  {
    uint8_t *sub_b = buf + kk2;
    memset(sub_b, 0U, (64U - kk2) * sizeof (uint8_t));
    memcpy(buf, k_1, kk2 * sizeof (uint8_t));
  }
  Hacl_Hash_Blake2b_blake2_params pv = p[0U];
  init_with_params(block_state.thd.snd, pv);
  uint8_t kk11 = i.key_length;
  uint32_t ite;
  if (kk11 != 0U)
  {
    ite = 64U;
  }
  else
  {
    ite = 0U;
  }
  Hacl_Hash_Blake2s_Simd128_state_t
  tmp = { .block_state = block_state, .buf = buf, .total_len = (uint64_t)ite };
  state[0U] = tmp;
}